

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipc_listener.cpp
# Opt level: O0

void __thiscall zmq::ipc_listener_t::in_event(ipc_listener_t *this)

{
  int iVar1;
  socklen_t *in_RCX;
  sockaddr *in_RDX;
  int in_ESI;
  socket_base_t *in_RDI;
  fd_t fd;
  fd_t in_stack_000000bc;
  stream_listener_base_t *in_stack_000000c0;
  socket_base_t *this_00;
  undefined4 in_stack_ffffffffffffff88;
  string *in_stack_ffffffffffffffc8;
  
  iVar1 = accept((ipc_listener_t *)in_RDI,in_ESI,in_RDX,in_RCX);
  if (iVar1 == -1) {
    this_00 = (socket_base_t *)(in_RDI->_sync)._mutex.__align;
    make_unconnected_bind_endpoint_pair(in_stack_ffffffffffffffc8);
    iVar1 = zmq_errno();
    socket_base_t::event_accept_failed
              (in_RDI,(endpoint_uri_pair_t *)CONCAT44(iVar1,in_stack_ffffffffffffff88),
               (int)((ulong)this_00 >> 0x20));
    endpoint_uri_pair_t::~endpoint_uri_pair_t((endpoint_uri_pair_t *)this_00);
  }
  else {
    stream_listener_base_t::create_engine(in_stack_000000c0,in_stack_000000bc);
  }
  return;
}

Assistant:

void zmq::ipc_listener_t::in_event ()
{
    const fd_t fd = accept ();

    //  If connection was reset by the peer in the meantime, just ignore it.
    //  TODO: Handle specific errors like ENFILE/EMFILE etc.
    if (fd == retired_fd) {
        _socket->event_accept_failed (
          make_unconnected_bind_endpoint_pair (_endpoint), zmq_errno ());
        return;
    }

    //  Create the engine object for this connection.
    create_engine (fd);
}